

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_read_fuzzer.c
# Opt level: O0

int LLVMFuzzerTestOneInput(uint8_t *data,size_t size)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  long lVar4;
  void *__dest;
  int buffered;
  int formatted;
  int require_termination;
  int minify;
  char *printed_json;
  uchar *copied;
  size_t offset;
  cJSON *json;
  size_t size_local;
  uint8_t *data_local;
  
  if ((((((4 < size) && (data[size - 1] == '\0')) && ((*data == '1' || (*data == '0')))) &&
       ((data[1] == '1' || (data[1] == '0')))) && ((data[2] == '1' || (data[2] == '0')))) &&
     ((data[3] == '1' || (data[3] == '0')))) {
    uVar1 = *data;
    uVar2 = data[2];
    uVar3 = data[3];
    lVar4 = cJSON_ParseWithOpts(data + 4,0,data[1] == '1');
    if (lVar4 != 0) {
      if (uVar3 == '1') {
        _require_termination = (void *)cJSON_PrintBuffered(lVar4,1,uVar2 == '1');
      }
      else if (uVar2 == '1') {
        _require_termination = (void *)cJSON_Print(lVar4);
      }
      else {
        _require_termination = (void *)cJSON_PrintUnformatted(lVar4);
      }
      if (_require_termination != (void *)0x0) {
        free(_require_termination);
      }
      if (uVar1 == '1') {
        __dest = malloc(size);
        if (__dest == (void *)0x0) {
          return 0;
        }
        memcpy(__dest,data,size);
        cJSON_Minify((long)__dest + 4);
        free(__dest);
      }
      cJSON_Delete(lVar4);
    }
  }
  return 0;
}

Assistant:

int LLVMFuzzerTestOneInput(const uint8_t* data, size_t size)
{
    cJSON *json;
    size_t offset = 4;
    unsigned char *copied;
    char *printed_json = NULL;
    int minify, require_termination, formatted, buffered;


    if(size <= offset) return 0;
    if(data[size-1] != '\0') return 0;
    if(data[0] != '1' && data[0] != '0') return 0;
    if(data[1] != '1' && data[1] != '0') return 0;
    if(data[2] != '1' && data[2] != '0') return 0;
    if(data[3] != '1' && data[3] != '0') return 0;

    minify              = data[0] == '1' ? 1 : 0;
    require_termination = data[1] == '1' ? 1 : 0;
    formatted           = data[2] == '1' ? 1 : 0;
    buffered            = data[3] == '1' ? 1 : 0;

    json = cJSON_ParseWithOpts((const char*)data + offset, NULL, require_termination);

    if(json == NULL) return 0;

    if(buffered)
    {
        printed_json = cJSON_PrintBuffered(json, 1, formatted);
    }
    else
    {
        /* unbuffered printing */
        if(formatted)
        {
            printed_json = cJSON_Print(json);
        }
        else
        {
            printed_json = cJSON_PrintUnformatted(json);
        }
    }

    if(printed_json != NULL) free(printed_json);

    if(minify)
    {
        copied = (unsigned char*)malloc(size);
        if(copied == NULL) return 0;

        memcpy(copied, data, size);

        cJSON_Minify((char*)copied + offset);

        free(copied);
    }

    cJSON_Delete(json);

    return 0;
}